

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator(RuleBasedCollator *this,RuleBasedCollator *other)

{
  RuleBasedCollator *other_local;
  RuleBasedCollator *this_local;
  
  Collator::Collator(&this->super_Collator,&other->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_004f00a0;
  this->data = other->data;
  this->settings = other->settings;
  this->tailoring = other->tailoring;
  this->cacheEntry = other->cacheEntry;
  Locale::Locale(&this->validLocale,&other->validLocale);
  this->explicitlySetAttributes = other->explicitlySetAttributes;
  this->actualLocaleIsSameAsValid = other->actualLocaleIsSameAsValid;
  SharedObject::addRef(&this->settings->super_SharedObject);
  SharedObject::addRef(&this->cacheEntry->super_SharedObject);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const RuleBasedCollator &other)
        : Collator(other),
          data(other.data),
          settings(other.settings),
          tailoring(other.tailoring),
          cacheEntry(other.cacheEntry),
          validLocale(other.validLocale),
          explicitlySetAttributes(other.explicitlySetAttributes),
          actualLocaleIsSameAsValid(other.actualLocaleIsSameAsValid) {
    settings->addRef();
    cacheEntry->addRef();
}